

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

natwm_error workspace_list_init(natwm_state *state,workspace_list **result)

{
  char *pcVar1;
  config_value *pcVar2;
  void *pvVar3;
  config_array *pcVar4;
  natwm_state *state_00;
  natwm_error nVar5;
  workspace_list *list;
  size_t sVar6;
  workspace *pwVar7;
  list *plVar8;
  ulong uVar9;
  undefined8 in_R9;
  char **ppcVar10;
  char *__s;
  undefined8 uVar11;
  config_array *local_48;
  config_array *workspace_names;
  natwm_state *local_38;
  
  uVar11 = 0x1089ce;
  local_48 = (config_array *)0x0;
  config_find_array(state->config,"workspaces",&local_48);
  list = workspace_list_create(10);
  nVar5 = MEMORY_ALLOCATION_ERROR;
  if (list != (workspace_list *)0x0) {
    ppcVar10 = DEFAULT_WORKSPACE_NAMES;
    workspace_names = (config_array *)result;
    local_38 = state;
    for (uVar9 = 0; state_00 = local_38, pcVar4 = workspace_names, uVar9 != 10; uVar9 = uVar9 + 1) {
      pcVar1 = *ppcVar10;
      __s = pcVar1;
      if ((local_48 != (config_array *)0x0) && (uVar9 < local_48->length)) {
        pcVar2 = local_48->values[uVar9];
        if ((pcVar2 == (config_value *)0x0) || (pcVar2->type != STRING)) {
          internal_logger(natwm_logger,LEVEL_WARNING,"Ignoring invalid workspace name",pcVar1);
        }
        else {
          __s = (pcVar2->data).string;
          sVar6 = strlen(__s);
          if (0x32 < sVar6) {
            internal_logger(natwm_logger,LEVEL_WARNING,
                            "Workspace name \'%s\' is too long. Max length is %zu",__s,0x32,in_R9,
                            uVar11);
            __s = pcVar1;
          }
        }
      }
      pwVar7 = workspace_create(__s,uVar9);
      if (pwVar7 == (workspace *)0x0) {
        workspace_list_destroy(list);
        return MEMORY_ALLOCATION_ERROR;
      }
      list->workspaces[uVar9] = pwVar7;
      ppcVar10 = ppcVar10 + 1;
    }
    plVar8 = local_38->monitor_list->monitors;
    uVar9 = 0;
    while (plVar8 = (list *)plVar8->head, plVar8 != (list *)0x0) {
      if ((list->count <= uVar9) || (pwVar7 = list->workspaces[uVar9], pwVar7 == (workspace *)0x0))
      {
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find workspace for monitor");
        break;
      }
      pvVar3 = (void *)plVar8->size;
      if (uVar9 == 0) {
        list->active_index = 0;
        pwVar7->is_focused = true;
      }
      pwVar7->is_visible = true;
      *(workspace **)((long)pvVar3 + 0x18) = pwVar7;
      uVar9 = uVar9 + 1;
    }
    ewmh_update_current_desktop(state_00,list->active_index);
    ewmh_update_desktop_names(state_00,list);
    reset_input_focus(state_00);
    pcVar4->length = (size_t)list;
    nVar5 = NO_ERROR;
  }
  return nVar5;
}

Assistant:

enum natwm_error workspace_list_init(const struct natwm_state *state,
                                     struct workspace_list **result)
{
        // First get the list of workspace names
        const struct config_array *workspace_names = NULL;

        config_find_array(state->config, "workspaces", &workspace_names);

        struct workspace_list *workspace_list = workspace_list_create(NATWM_WORKSPACE_COUNT);

        if (workspace_list == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        for (size_t i = 0; i < NATWM_WORKSPACE_COUNT; ++i) {
                struct workspace *workspace = workspace_init(workspace_names, i);

                if (workspace == NULL) {
                        workspace_list_destroy(workspace_list);

                        return MEMORY_ALLOCATION_ERROR;
                }

                workspace_list->workspaces[i] = workspace;
        }

        attach_to_monitors(state->monitor_list, workspace_list);

        ewmh_update_current_desktop(state, workspace_list->active_index);
        ewmh_update_desktop_names(state, workspace_list);

        reset_input_focus(state);

        *result = workspace_list;

        return NO_ERROR;
}